

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::LessThanEqualTest<short,unsigned_short>(void)

{
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_28;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_26;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_24;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_22;
  int local_20 [4];
  
  local_20[3] = 3;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_22,local_20 + 3);
  if (1 < local_22.m_int) {
    local_20[2] = 4;
    SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_24,local_20 + 2);
    if (local_24.m_int < 6) {
      local_20[1] = 6;
      SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_26,local_20 + 1);
      local_20[0] = 7;
      SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_28,local_20);
      return (int)local_26.m_int <= (int)(uint)local_28.m_int;
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool LessThanEqualTest()
	{
		return
			(U)2 <= SafeInt<T>(3) &&
			SafeInt<T>(4) <= (U)5 &&
			SafeInt<T>(6) <= SafeInt<U>(7);
	}